

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_&> __thiscall
kj::
Table<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>>
::find<0ul,kj::PathPtr&>
          (Table<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>>
           *this,PathPtr *params)

{
  Entry *pEVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry> AVar3;
  unsigned_long *pos;
  Entry *local_50;
  PathPtr *local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos583;
  PathPtr *params_local;
  Table<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>_>
  *this_local;
  
  _pos583.field_1 = in_RDX;
  pEVar1 = (Entry *)get<0ul,kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>&>
                              ((HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
                                *)(params + 2));
  AVar3 = Vector<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>::
          asPtr((Vector<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                 *)params);
  fwd<kj::PathPtr&>((PathPtr *)_pos583.field_1);
  local_50 = AVar3.ptr;
  local_48 = (PathPtr *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = pEVar1;
  HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>::
  find<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::PathPtr&>
            ((HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
              *)&local_40,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>(&local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_&>::Maybe
              ((Maybe<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_&>
                *)this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    pEVar1 = Vector<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>::
             operator[]((Vector<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                         *)params,*puVar2);
    Maybe<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_&>::Maybe
              ((Maybe<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_&>
                *)this,pEVar1);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_&>)
         (Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}